

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Thread::Thread(Thread *this,Store *store,Stream *trace_stream)

{
  set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  *this_00;
  pair<std::_Rb_tree_const_iterator<wabt::interp::Thread_*>,_bool> pVar1;
  unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  local_50;
  undefined1 local_48 [8];
  Options options;
  Thread *local_28;
  Stream *local_20;
  Stream *trace_stream_local;
  Store *store_local;
  Thread *this_local;
  
  local_20 = trace_stream;
  trace_stream_local = (Stream *)store;
  store_local = (Store *)this;
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&this->frames_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&this->values_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->refs_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->exceptions_);
  this->store_ = (Store *)trace_stream_local;
  this->inst_ = (Instance *)0x0;
  this->mod_ = (Module *)0x0;
  this->trace_stream_ = local_20;
  std::
  unique_ptr<wabt::interp::Thread::TraceSource,std::default_delete<wabt::interp::Thread::TraceSource>>
  ::unique_ptr<std::default_delete<wabt::interp::Thread::TraceSource>,void>
            ((unique_ptr<wabt::interp::Thread::TraceSource,std::default_delete<wabt::interp::Thread::TraceSource>>
              *)&this->trace_source_);
  this_00 = Store::threads((Store *)trace_stream_local);
  local_28 = this;
  pVar1 = std::
          set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
          ::insert(this_00,&local_28);
  options.trace_stream = (Stream *)pVar1.first._M_node;
  Options::Options((Options *)local_48);
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::reserve
            (&this->frames_,(ulong)(uint)local_48._4_4_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::reserve
            (&this->values_,(ulong)(uint)local_48._0_4_);
  if (local_20 != (Stream *)0x0) {
    std::make_unique<wabt::interp::Thread::TraceSource,wabt::interp::Thread*>((Thread **)&local_50);
    std::
    unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    ::operator=(&this->trace_source_,&local_50);
    std::
    unique_ptr<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
    ::~unique_ptr(&local_50);
  }
  return;
}

Assistant:

Thread::Thread(Store& store, Stream* trace_stream)
    : store_(store), trace_stream_(trace_stream) {
  store.threads().insert(this);

  Thread::Options options;
  frames_.reserve(options.call_stack_size);
  values_.reserve(options.value_stack_size);
  if (trace_stream) {
    trace_source_ = std::make_unique<TraceSource>(this);
  }
}